

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall
libtorrent::torrent_info::add_tracker(torrent_info *this,string *url,int tier,tracker_source source)

{
  announce_entry *paVar1;
  pointer paVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  _Var7;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __it;
  pointer paVar8;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __i;
  pointer paVar9;
  string_view u;
  announce_entry e;
  announce_entry local_90;
  
  __it._M_current =
       (this->m_urls).
       super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
       .
       super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)paVar1 - (long)__it._M_current;
  lVar6 = (lVar4 >> 5) * -0x5555555555555555 >> 2;
  if (0 < lVar6) {
    paVar8 = __it._M_current + lVar6 * 4;
    lVar6 = lVar6 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)url,__it);
      _Var7._M_current = __it._M_current;
      if (bVar3) goto LAB_00369c0b;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)url,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_00369c0b;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)url,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_00369c0b;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
              ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                            *)url,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_00369c0b;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    lVar4 = (long)paVar1 - (long)paVar8;
    __it._M_current = paVar8;
  }
  lVar4 = (lVar4 >> 5) * -0x5555555555555555;
  if (lVar4 == 1) {
LAB_00369bf7:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
            ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                          *)url,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar3) {
      _Var7._M_current = paVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_00369bdf:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
            ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                          *)url,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00369bf7;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_00369c14;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::$_0>
            ::operator()((_Iter_pred<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                          *)url,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00369bdf;
    }
  }
LAB_00369c0b:
  if (_Var7._M_current != paVar1) {
    return;
  }
LAB_00369c14:
  u._M_str = (url->_M_dataplus)._M_p;
  u._M_len = url->_M_string_length;
  v1_2::announce_entry::announce_entry(&local_90,u);
  local_90.tier = (uint8_t)tier;
  local_90._90_1_ = local_90._90_1_ & 0xf0 | (byte)source & 0xf;
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::push_back(&(this->m_urls).
               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ,&local_90);
  paVar8 = (this->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (this->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar8 != paVar2) {
    uVar5 = ((long)paVar2 - (long)paVar8 >> 5) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
              (paVar8,paVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)paVar2 - (long)paVar8 < 0x601) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                (paVar8,paVar2);
    }
    else {
      paVar9 = paVar8 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                (paVar8,paVar9);
      for (; paVar9 != paVar2; paVar9 = paVar9 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                  (paVar9);
      }
    }
  }
  v1_2::announce_entry::~announce_entry(&local_90);
  return;
}

Assistant:

void torrent_info::add_tracker(std::string const& url, int const tier
		, announce_entry::tracker_source const source)
	{
		TORRENT_ASSERT_PRECOND(!url.empty());
		auto const i = std::find_if(m_urls.begin(), m_urls.end()
			, [&url](announce_entry const& ae) { return ae.url == url; });
		if (i != m_urls.end()) return;

		announce_entry e(url);
		e.tier = std::uint8_t(tier);
		e.source = source;
		m_urls.push_back(e);

		std::sort(m_urls.begin(), m_urls.end()
			, [] (announce_entry const& lhs, announce_entry const& rhs)
			{ return lhs.tier < rhs.tier; });
	}